

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall ON_3dmRenderSettings::Dump(ON_3dmRenderSettings *this,ON_TextLog *text_log)

{
  wchar_t *pwVar1;
  char *pcVar2;
  ON_TextLog *text_log_local;
  ON_3dmRenderSettings *this_local;
  
  pcVar2 = "false";
  if ((this->m_bCustomImageSize & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bCustomImageSize = %s\n",pcVar2);
  ON_TextLog::Print(text_log,"m_image_width = %d\n",(ulong)(uint)this->m_image_width);
  ON_TextLog::Print(text_log,"m_image_height = %d\n",(ulong)(uint)this->m_image_height);
  ON_TextLog::Print(text_log,"m_image_dpi = %g\n",this->m_image_dpi);
  ON_TextLog::Print(text_log,"m_image_us = %d\n",(ulong)this->m_image_us);
  ON_TextLog::Print(text_log,"m_ambient_light rgb = ");
  ON_TextLog::PrintRGB(text_log,&this->m_ambient_light);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"m_background_style = %d\n",(ulong)(uint)this->m_background_style);
  ON_TextLog::Print(text_log,"m_background_color rgb = ");
  ON_TextLog::PrintRGB(text_log,&this->m_background_color);
  ON_TextLog::Print(text_log,"\n");
  ON_TextLog::Print(text_log,"m_background_bitmap_filename = ");
  ON_TextLog::Print(text_log,&this->m_background_bitmap_filename);
  ON_TextLog::Print(text_log,"\n");
  pcVar2 = "false";
  if ((this->m_bUseHiddenLights & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bUseHiddenLights = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bDepthCue & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bDepthCue = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bFlatShade & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bFlatShade = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderBackfaces & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderBackfaces = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderPoints & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderPoints = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderCurves & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderCurves = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderIsoparams & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderIsoparams = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderMeshEdges & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderMeshEdges = %s\n",pcVar2);
  pcVar2 = "false";
  if ((this->m_bRenderAnnotation & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bRenderAnnotation = %s\n",pcVar2);
  ON_TextLog::Print(text_log,"m_antialias_style = %d\n",(ulong)(uint)this->m_antialias_style);
  ON_TextLog::Print(text_log,"m_shadowmap_style = %d\n",(ulong)(uint)this->m_shadowmap_style);
  ON_TextLog::Print(text_log,"m_shadowmap_width = %d\n",(ulong)(uint)this->m_shadowmap_width);
  ON_TextLog::Print(text_log,"m_shadowmap_height = %d\n",(ulong)(uint)this->m_shadowmap_height);
  ON_TextLog::Print(text_log,"m_shadowmap_offset = %g\n",this->m_shadowmap_offset);
  pcVar2 = "false";
  if ((this->m_bScaleBackgroundToFit & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bScaleBackgroundToFit = %s\n",pcVar2);
  ON_TextLog::Print(text_log,L"m_rendering_source = %u\n",(ulong)this->m_rendering_source);
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_specific_viewport);
  ON_TextLog::Print(text_log,L"m_specific_viewport = %s\n",pwVar1);
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_named_view);
  ON_TextLog::Print(text_log,L"m_named_view = %s\n",pwVar1);
  pwVar1 = ON_wString::operator_cast_to_wchar_t_(&this->m_snapshot);
  ON_TextLog::Print(text_log,L"m_snapshot = %s\n",pwVar1);
  pcVar2 = "false";
  if ((this->m_bForceViewportAspectRatio & 1U) != 0) {
    pcVar2 = "true";
  }
  ON_TextLog::Print(text_log,"m_bForceViewportAspectRatio = %s\n",pcVar2);
  return;
}

Assistant:

void ON_3dmRenderSettings::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("m_bCustomImageSize = %s\n",m_bCustomImageSize?"true":"false");
  text_log.Print("m_image_width = %d\n",m_image_width);
  text_log.Print("m_image_height = %d\n",m_image_height);
  text_log.Print("m_image_dpi = %g\n",m_image_dpi);
  text_log.Print("m_image_us = %d\n",m_image_us);
  text_log.Print("m_ambient_light rgb = ");text_log.PrintRGB(m_ambient_light);text_log.Print("\n");
  text_log.Print("m_background_style = %d\n",m_background_style);
  text_log.Print("m_background_color rgb = ");text_log.PrintRGB(m_background_color);text_log.Print("\n");
  text_log.Print("m_background_bitmap_filename = ");text_log.Print(m_background_bitmap_filename);text_log.Print("\n");
  text_log.Print("m_bUseHiddenLights = %s\n",m_bUseHiddenLights?"true":"false");
  text_log.Print("m_bDepthCue = %s\n",m_bDepthCue?"true":"false");
  text_log.Print("m_bFlatShade = %s\n",m_bFlatShade?"true":"false");
  text_log.Print("m_bRenderBackfaces = %s\n",m_bRenderBackfaces?"true":"false");
  text_log.Print("m_bRenderPoints = %s\n",m_bRenderPoints?"true":"false");
  text_log.Print("m_bRenderCurves = %s\n",m_bRenderCurves?"true":"false");
  text_log.Print("m_bRenderIsoparams = %s\n",m_bRenderIsoparams?"true":"false");
  text_log.Print("m_bRenderMeshEdges = %s\n",m_bRenderMeshEdges?"true":"false");
  text_log.Print("m_bRenderAnnotation = %s\n",m_bRenderAnnotation?"true":"false");

  text_log.Print("m_antialias_style = %d\n",m_antialias_style);
  text_log.Print("m_shadowmap_style = %d\n",m_shadowmap_style);
  text_log.Print("m_shadowmap_width = %d\n",m_shadowmap_width);
  text_log.Print("m_shadowmap_height = %d\n",m_shadowmap_height);
  text_log.Print("m_shadowmap_offset = %g\n",m_shadowmap_offset);

  text_log.Print("m_bScaleBackgroundToFit = %s\n",m_bScaleBackgroundToFit?"true":"false");

  text_log.Print(L"m_rendering_source = %u\n", int(m_rendering_source));
  text_log.Print(L"m_specific_viewport = %s\n", (const wchar_t*)m_specific_viewport);
  text_log.Print(L"m_named_view = %s\n", (const wchar_t*)m_named_view);
  text_log.Print(L"m_snapshot = %s\n", (const wchar_t*)m_snapshot);

  text_log.Print("m_bForceViewportAspectRatio = %s\n", m_bForceViewportAspectRatio ? "true" : "false");

  // 19th April 2023 John Croudy. I thought it would be handy to add the RDK XML for debugging.
  // I didn't know that the state of the text log is checked with a hash by the OpenNURBS tests.
  // Since the RDK XML can change textually (e.g., different property order), the string is never
  // guaranteed to be the same for the same actual XML state. Therefore, this broke the OpenNURBS tests.
  //const auto& priv = ON_3dmRenderSettingsPrivate::Get(*this);
  //const auto s = priv._rdk_document_data.NodeForRead().String();
  //text_log.Print("RDK XML = ");
  //text_log.PrintString(s);
}